

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O1

Rect __thiscall lunasvg::SVGTextElement::boundingBox(SVGTextElement *this,bool includeStroke)

{
  SVGTextPositioningElement *pSVar1;
  SVGTextFragment *fragment;
  undefined7 in_register_00000031;
  pointer pSVar2;
  float fVar3;
  Rect boundingBox;
  Rect fragmentRect;
  Transform fragmentTranform;
  Rect local_98;
  undefined4 local_84;
  float local_80;
  float local_7c;
  Transform local_78;
  pointer local_60;
  Rect local_58;
  Transform local_48;
  
  local_84 = (undefined4)CONCAT71(in_register_00000031,includeStroke);
  local_98 = (Rect)(ZEXT816((ulong)0xbf800000bf800000) << 0x40);
  pSVar2 = (this->m_fragments).
           super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_60 = (this->m_fragments).
             super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar2 != local_60) {
    do {
      pSVar1 = pSVar2->element;
      Transform::rotated(&local_78,pSVar2->angle,pSVar2->x,pSVar2->y);
      Transform::operator*(&local_48,&local_78,&pSVar2->lengthAdjustTransform);
      local_7c = pSVar2->x;
      local_80 = pSVar2->y;
      local_78.m_matrix.b = Font::ascent(&pSVar1->m_font);
      local_78.m_matrix.b = local_80 - local_78.m_matrix.b;
      local_78.m_matrix.c = pSVar2->width;
      local_78.m_matrix.d = (pSVar2->element->super_SVGGraphicsElement).super_SVGElement.m_font_size
      ;
      local_78.m_matrix.a = local_7c;
      if ((((char)local_84 != '\0') && (0.0 < (pSVar1->m_stroke).m_opacity)) &&
         (((pSVar1->m_stroke).m_element != (SVGPaintElement *)0x0 ||
          (0xffffff < (pSVar1->m_stroke).m_color.m_value)))) {
        fVar3 = pSVar2->element->m_stroke_width * 0.5;
        local_78.m_matrix.a = local_7c - fVar3;
        local_78.m_matrix.b = local_78.m_matrix.b - fVar3;
        local_78.m_matrix.c = local_78.m_matrix.c + fVar3 + fVar3;
        local_78.m_matrix.d = fVar3 + fVar3 + local_78.m_matrix.d;
      }
      local_58 = Transform::mapRect(&local_48,(Rect *)&local_78);
      local_98 = Rect::united(&local_98,&local_58);
      pSVar2 = pSVar2 + 1;
    } while (pSVar2 != local_60);
  }
  if ((local_98.w < 0.0) || (local_98.h < 0.0)) {
    local_98 = (Rect)ZEXT816(0);
  }
  return local_98;
}

Assistant:

Rect SVGTextElement::boundingBox(bool includeStroke) const
{
    auto boundingBox = Rect::Invalid;
    for(const auto& fragment : m_fragments) {
        const auto& font = fragment.element->font();
        const auto& stroke = fragment.element->stroke();
        auto fragmentTranform = Transform::rotated(fragment.angle, fragment.x, fragment.y) * fragment.lengthAdjustTransform;
        auto fragmentRect = Rect(fragment.x, fragment.y - font.ascent(), fragment.width, fragment.element->font_size());
        if(includeStroke && stroke.isRenderable())
            fragmentRect.inflate(fragment.element->stroke_width() / 2.f);
        boundingBox.unite(fragmentTranform.mapRect(fragmentRect));
    }

    if(!boundingBox.isValid())
        boundingBox = Rect::Empty;
    return boundingBox;
}